

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cpp
# Opt level: O0

void __thiscall
iDynTree::ArticulatedBodyAlgorithmInternalBuffers::resize
          (ArticulatedBodyAlgorithmInternalBuffers *this,Model *model)

{
  JointDOFsDoubleArray *in_RSI;
  Model *in_RDI;
  
  DOFSpatialMotionArray::resize((DOFSpatialMotionArray *)in_RSI,in_RDI);
  DOFSpatialForceArray::resize((DOFSpatialForceArray *)in_RSI,in_RDI);
  JointDOFsDoubleArray::resize(in_RSI,in_RDI);
  JointDOFsDoubleArray::resize(in_RSI,in_RDI);
  LinkVelArray::resize((LinkVelArray *)in_RSI,in_RDI);
  LinkAccArray::resize((LinkAccArray *)in_RSI,in_RDI);
  LinkAccArray::resize((LinkAccArray *)in_RSI,in_RDI);
  LinkArticulatedBodyInertias::resize((LinkArticulatedBodyInertias *)in_RSI,in_RDI);
  LinkWrenches::resize((LinkWrenches *)in_RSI,in_RDI);
  return;
}

Assistant:

void ArticulatedBodyAlgorithmInternalBuffers::resize(const Model& model)
{
    S.resize(model);
    U.resize(model);
    D.resize(model);
    u.resize(model);
    linksVel.resize(model);
    linksBiasAcceleration.resize(model);
    linksAccelerations.resize(model);
    linkABIs.resize(model);
    linksBiasWrench.resize(model);
    // debug
    //pa.resize(model);
}